

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSingularFieldHasBits
          (MessageGenerator *this,FieldDescriptor *field,Formatter *format)

{
  int iVar1;
  bool bVar2;
  CppType CVar3;
  LogMessage *other;
  char *pcVar4;
  allocator local_71;
  LogMessage local_70;
  Hex local_38;
  
  if (*(char *)(*(long *)(field + 0x78) + 0x4f) == '\x01') {
    pcVar4 = 
    "inline bool $classname$::has_$name$() const {\n$annotate_accessor$  return _weak_field_map_.Has($number$);\n}\n"
    ;
LAB_002bc343:
    Formatter::operator()<>(format,pcVar4);
    return;
  }
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x3c) == 3) {
    CVar3 = FieldDescriptor::cpp_type(field);
    if (CVar3 == CPPTYPE_MESSAGE) {
      bVar2 = IsLazy(field,&this->options_);
      pcVar4 = 
      "inline bool $classname$::_internal_has_$name$() const {\n  return this != internal_default_instance() && $name$_ != nullptr;\n}\n"
      ;
      if (bVar2) {
        pcVar4 = 
        "inline bool $classname$::_internal_has_$name$() const {\n  return !$name$_.IsCleared();\n}\n"
        ;
      }
      Formatter::operator()<>(format,pcVar4);
      pcVar4 = 
      "inline bool $classname$::has_$name$() const {\n$annotate_accessor$  return _internal_has_$name$();\n}\n"
      ;
      goto LAB_002bc343;
    }
  }
  else {
    pcVar4 = FieldDescriptor::index(field,(char *)field,(int)format);
    iVar1 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)pcVar4];
    if (iVar1 < 0) {
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0x325);
      other = internal::LogMessage::operator<<(&local_70,"CHECK failed: (has_bit_index) >= (0): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_38,other);
      internal::LogMessage::~LogMessage(&local_70);
    }
    std::__cxx11::string::string((string *)&local_70,"has_array_index",&local_71);
    local_38.value = CONCAT44(local_38.value._4_4_,iVar1 / 0x20);
    Formatter::Set<int>(format,(string *)&local_70,(int *)&local_38);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_70,"has_mask",&local_71);
    local_38.value = 1L << ((byte)iVar1 & 0x1f);
    local_38.spec = ZERO_PAD_8;
    Formatter::Set<google::protobuf::strings::Hex>(format,(string *)&local_70,&local_38);
    std::__cxx11::string::~string((string *)&local_70);
    Formatter::operator()<>
              (format,
               "inline bool $classname$::_internal_has_$name$() const {\n  bool value = (_has_bits_[$has_array_index$] & 0x$has_mask$u) != 0;\n"
              );
    CVar3 = FieldDescriptor::cpp_type(field);
    if (CVar3 == CPPTYPE_MESSAGE) {
      bVar2 = IsLazy(field,&this->options_);
      if (!bVar2) {
        Formatter::operator()<>(format,"  PROTOBUF_ASSUME(!value || $name$_ != nullptr);\n");
      }
    }
    Formatter::operator()<>
              (format,
               "  return value;\n}\ninline bool $classname$::has_$name$() const {\n$annotate_accessor$  return _internal_has_$name$();\n}\n"
              );
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSingularFieldHasBits(
    const FieldDescriptor* field, Formatter format) {
  if (field->options().weak()) {
    format(
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_accessor$"
        "  return _weak_field_map_.Has($number$);\n"
        "}\n");
    return;
  }
  if (HasFieldPresence(descriptor_->file())) {
    // N.B.: without field presence, we do not use has-bits or generate
    // has_$name$() methods.
    int has_bit_index = has_bit_indices_[field->index()];
    GOOGLE_CHECK_GE(has_bit_index, 0);

    format.Set("has_array_index", has_bit_index / 32);
    format.Set("has_mask",
               strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
    format(
        "inline bool $classname$::_internal_has_$name$() const {\n"
        "  bool value = "
        "(_has_bits_[$has_array_index$] & 0x$has_mask$u) != 0;\n");

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !IsLazy(field, options_)) {
      // We maintain the invariant that for a submessage x, has_x() returning
      // true implies that x_ is not null. By giving this information to the
      // compiler, we allow it to eliminate unnecessary null checks later on.
      format("  PROTOBUF_ASSUME(!value || $name$_ != nullptr);\n");
    }

    format(
        "  return value;\n"
        "}\n"
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_accessor$"
        "  return _internal_has_$name$();\n"
        "}\n");
  } else {
    // Message fields have a has_$name$() method.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (IsLazy(field, options_)) {
        format(
            "inline bool $classname$::_internal_has_$name$() const {\n"
            "  return !$name$_.IsCleared();\n"
            "}\n");
      } else {
        format(
            "inline bool $classname$::_internal_has_$name$() const {\n"
            "  return this != internal_default_instance() "
            "&& $name$_ != nullptr;\n"
            "}\n");
      }
      format(
          "inline bool $classname$::has_$name$() const {\n"
          "$annotate_accessor$"
          "  return _internal_has_$name$();\n"
          "}\n");
    }
  }
}